

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byteorder.c
# Opt level: O0

void endianness(List *code,ByteSize desired_size,ByteOrder hint,BOOL strong_hint,
               ExprInfo *field_info)

{
  ListStruct *pLVar1;
  List *pLVar2;
  ByteSize BVar3;
  char *pcVar4;
  ByteOrder hint_00;
  ExprInfo EVar5;
  ByteSize local_1dc;
  ByteSize local_1bc;
  ByteSize local_1a4;
  ByteSize s;
  BOOL local_198;
  ByteOrder local_16c;
  ExprInfo info2;
  List *l2;
  char buf [256];
  Token *t;
  ByteOrder local_34;
  ByteSize BStack_30;
  ExprInfo info;
  ExprInfo *field_info_local;
  BOOL strong_hint_local;
  ByteOrder hint_local;
  ByteSize desired_size_local;
  List *code_local;
  
  EVar5 = expr_info(code,hint,field_info);
  if (code != (List *)0x0) {
    if ((strong_hint == FALSE) || ((code->token).type != TOK_DOLLAR_NUMBER)) {
      if ((code->token).type == TOK_LIST) {
        pLVar1 = code->car;
        local_34 = EVar5.order;
        BStack_30 = EVar5.size;
        switch((pLVar1->token).type) {
        case TOK_IF:
          for (info2._4_8_ = code->car->cdr; info2._4_8_ != 0;
              info2._4_8_ = *(undefined8 *)info2._4_8_) {
            endianness((List *)info2._4_8_,BS_UNKNOWN,BO_NATIVE,FALSE,field_info);
          }
          break;
        case TOK_SWITCH:
          endianness(code->car->cdr,BS_WORD,BO_NATIVE,TRUE,field_info);
          for (info2._4_8_ = code->car->cdr->cdr; info2._4_8_ != 0;
              info2._4_8_ = *(undefined8 *)info2._4_8_) {
            endianness(*(List **)(info2._4_8_ + 8),BS_WORD,BO_NATIVE,TRUE,field_info);
            endianness((List *)**(undefined8 **)(info2._4_8_ + 8),BS_UNKNOWN,BO_NATIVE,FALSE,
                       field_info);
          }
          break;
        default:
          pLVar2 = code->car;
          pcVar4 = unparse_token(&pLVar1->token,(char *)&l2);
          parse_error(pLVar2,"Unhandled operator %s in endianness().\n",pcVar4);
          break;
        case TOK_AND:
        case TOK_OR:
        case TOK_XOR:
        case TOK_NOT:
          for (info2._4_8_ = code->car->cdr; info2._4_8_ != 0;
              info2._4_8_ = *(undefined8 *)info2._4_8_) {
            endianness((List *)info2._4_8_,BS_UNKNOWN,BO_NATIVE,FALSE,field_info);
          }
          break;
        case TOK_EQUAL:
        case TOK_NOT_EQUAL:
          EVar5 = expr_info(code->car->cdr,BO_NATIVE,field_info);
          pLVar2 = code->car->cdr;
          BVar3 = expr_list_max_size(code->car->cdr,BO_NATIVE,field_info);
          local_16c = EVar5.order;
          endianness(pLVar2,BVar3,local_16c,TRUE,field_info);
          break;
        case TOK_GREATER_THAN:
        case TOK_LESS_THAN:
        case TOK_GREATER_OR_EQUAL:
        case TOK_LESS_OR_EQUAL:
          for (info2._4_8_ = code->car->cdr; info2._4_8_ != 0;
              info2._4_8_ = *(undefined8 *)info2._4_8_) {
            BVar3 = expr_list_max_size(code->car->cdr,BO_NATIVE,field_info);
            endianness((List *)info2._4_8_,BVar3,BO_NATIVE,TRUE,field_info);
          }
          break;
        case TOK_SHIFT_LEFT:
        case TOK_SHIFT_RIGHT:
        case TOK_PLUS:
        case TOK_MINUS:
        case TOK_MULTIPLY:
        case TOK_DIVIDE:
        case TOK_MOD:
        case TOK_BITWISE_AND:
        case TOK_BITWISE_OR:
        case TOK_BITWISE_XOR:
        case TOK_BITWISE_NOT:
          for (info2._4_8_ = code->car->cdr; info2._4_8_ != 0;
              info2._4_8_ = *(undefined8 *)info2._4_8_) {
            local_1bc = desired_size;
            if (BStack_30 != BS_UNKNOWN) {
              local_1bc = BStack_30;
            }
            endianness((List *)info2._4_8_,local_1bc,local_34,TRUE,field_info);
          }
          break;
        case TOK_ASSIGN:
          if (((((code->car->cdr->token).type == TOK_CCC) ||
               ((code->car->cdr->token).type == TOK_CCN)) ||
              ((code->car->cdr->token).type == TOK_CCV)) ||
             (((code->car->cdr->token).type == TOK_CCX || ((code->car->cdr->token).type == TOK_CCNZ)
              ))) {
            endianness(code->car->cdr->cdr,desired_size,hint,strong_hint,field_info);
          }
          else {
            if (BStack_30 == BS_UNKNOWN) {
              parse_error(code->car->cdr,"Attempting to assign to object of unknown size!\n");
              print_list((FILE *)_stderr,code);
              putc(10,_stderr);
            }
            endianness(code->car->cdr,BStack_30,hint,FALSE,field_info);
            endianness(code->car->cdr->cdr,BStack_30,local_34,TRUE,field_info);
          }
          break;
        case TOK_FUNC_CALL:
          for (info2._4_8_ = code->car->cdr->cdr; info2._4_8_ != 0;
              info2._4_8_ = *(undefined8 *)info2._4_8_) {
            endianness((List *)info2._4_8_,BS_UNKNOWN,BO_NATIVE,TRUE,field_info);
          }
          break;
        case TOK_CAST:
          for (info2._4_8_ = code->car->cdr->cdr; info2._4_8_ != 0;
              info2._4_8_ = *(undefined8 *)info2._4_8_) {
            endianness((List *)info2._4_8_,BS_UNKNOWN,BO_NATIVE,TRUE,field_info);
          }
          break;
        case TOK_DEREF:
          if ((pLVar1->token).u.reginfo.size == '\0') {
            endianness(code->car->cdr->cdr,BS_LONG,BO_NATIVE,TRUE,field_info);
          }
          else {
            endianness(code->car->cdr,BS_LONG,BO_NATIVE,TRUE,field_info);
          }
          break;
        case TOK_SWAP:
          hint_00 = BO_NATIVE;
          if (hint == BO_NATIVE) {
            hint_00 = BO_BIG_ENDIAN;
          }
          endianness(code->car->cdr,(uint)(pLVar1->token).u.reginfo.size,hint_00,strong_hint,
                     field_info);
          break;
        case TOK_EXPLICIT_LIST:
          for (info2._4_8_ = code->car->cdr; info2._4_8_ != 0;
              info2._4_8_ = *(undefined8 *)info2._4_8_) {
            endianness((List *)info2._4_8_,desired_size,hint,strong_hint,field_info);
          }
          break;
        case TOK_LIST:
          endianness(code->car,desired_size,hint,strong_hint,field_info);
        }
      }
      EVar5 = expr_info(code,hint,field_info);
      local_198 = EVar5.sgnd;
      if ((strong_hint != FALSE) && (local_34 = EVar5.order, local_34 != hint)) {
        BStack_30 = EVar5.size;
        if (desired_size == BS_UNKNOWN) {
          local_1a4 = BStack_30;
        }
        else {
          local_1a4 = desired_size;
          if (BStack_30 != BS_UNKNOWN) {
            local_1dc = desired_size;
            if (BStack_30 <= desired_size) {
              local_1dc = BStack_30;
            }
            local_1a4 = local_1dc;
          }
        }
        swap(code,local_1a4,local_198);
      }
    }
    else {
      field_info[(code->token).u.reginfo.which].order = hint;
    }
  }
  return;
}

Assistant:

static void
endianness (List *code, ByteSize desired_size, ByteOrder hint,
	    BOOL strong_hint, ExprInfo *field_info)
{
  ExprInfo info = expr_info (code, hint, field_info);
  Token *t = &code->token;
  char buf[256];

  if (code == NULL)
    return;

#if 0
  printf ("Endianness: desired_size = %d, hint = %d, strong_hint = %d\n",
	  desired_size, hint, strong_hint);
  print_list (stdout, code);
  putchar ('\n');
#endif

  if (strong_hint && t->type == TOK_DOLLAR_NUMBER)
    {
      field_info[t->u.dollarinfo.which].order = hint;
      return;
    }
    
  if (t->type == TOK_LIST)
    {
      List *l2;
      
      t = &code->car->token;
      switch (t->type) {
      case TOK_SHIFT_RIGHT:
      case TOK_SHIFT_LEFT:
      case TOK_PLUS:
      case TOK_MINUS:
      case TOK_MULTIPLY:
      case TOK_DIVIDE:
      case TOK_MOD:
      case TOK_BITWISE_AND:
      case TOK_BITWISE_OR:
      case TOK_BITWISE_XOR:
      case TOK_BITWISE_NOT:
	/* Force all operands to be the same endianness... */
	for (l2 = CDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    endianness (l2, ((info.size == BS_UNKNOWN)
			     ? desired_size : info.size),
			info.order, TRUE, field_info);
	  }
	break;

      case TOK_EXPLICIT_LIST:
	for (l2 = CDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    /* Just process everything else. */
	    endianness (l2, desired_size, hint, strong_hint, field_info);
	  }
	break;

      case TOK_LIST:
	endianness (code->car, desired_size, hint, strong_hint, field_info);
	break;

      case TOK_ASSIGN:
	if (IS_CCBIT_TOKEN (CDAR (code)->token.type))
	  {
#ifdef CCR_ELEMENT_8_BITS
	    endianness (CDDAR (code), BS_UNKNOWN, BO_NATIVE, TRUE,
			field_info);
#else   /* !CCR_ELEMENT_8_BITS */
	    endianness (CDDAR (code), desired_size, hint, strong_hint,
			field_info);
#endif  /* !CCR_ELEMENT_8_BITS */
	  }
	else
	  {
	    if (info.size == BS_UNKNOWN)
	      {
		parse_error (CDAR (code), "Attempting to assign to object "
			     "of unknown size!\n");
		print_list (stderr, code);
		putc ('\n', stderr);
	      }

	    /* Process LHS. */
	    endianness (CDAR (code), info.size, hint, FALSE, field_info);
	    
	    /* Force RHS to have same type as LHS. */
	    endianness (CDDAR (code), info.size, info.order, TRUE, field_info);
	  }
	break;

      case TOK_SWAP:
	/* Process operand. */
	endianness (CDAR (code), t->u.swapinfo.size,
		    (hint == BO_NATIVE) ? BO_BIG_ENDIAN : BO_NATIVE,
		    strong_hint, field_info);
	break;

      case TOK_DEREF:
	/* Force address to be native. */
	if (t->u.derefinfo.size != 0)
	  endianness (CDAR (code), BS_LONG, BO_NATIVE, TRUE, field_info);
	else
	  endianness (CDDAR (code), BS_LONG, BO_NATIVE, TRUE, field_info);
	break;

      case TOK_EQUAL:
      case TOK_NOT_EQUAL:
	{
	  /* Force both operands to be the same endianness (don't
	   * care which since we are testing equality).
	   */
	  ExprInfo info2 = expr_info (CDAR (code), BO_NATIVE, field_info);
	  endianness (CDAR (code), expr_list_max_size (CDAR (code),
						       BO_NATIVE,
						       field_info),
		      info2.order, TRUE, field_info);
	}
	break;

      case TOK_GREATER_THAN:
      case TOK_GREATER_OR_EQUAL:
      case TOK_LESS_THAN:
      case TOK_LESS_OR_EQUAL:
	/* Force all operands to be BO_NATIVE. */
	for (l2 = CDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    endianness (l2, expr_list_max_size (CDAR (code), BO_NATIVE,
						field_info),
			BO_NATIVE, TRUE, field_info);
	  }
	break;

      case TOK_AND:
      case TOK_OR:
      case TOK_XOR:
      case TOK_NOT:
	/* Process all of the boolean things.  Don't care about endianness. */
	for (l2 = CDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    endianness (l2, BS_UNKNOWN, BO_NATIVE, FALSE, field_info);
	  }
	break;

      case TOK_IF:
	for (l2 = CDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    /* Just process everything. */
	    endianness (l2, BS_UNKNOWN, BO_NATIVE, FALSE, field_info);
	  }
	break;

      case TOK_SWITCH:
	/* Force switch value to be native. */
	endianness (CDAR (code), BS_WORD, BO_NATIVE, TRUE, field_info);
	for (l2 = CDDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    /* Force case value to be native. */
	    endianness (l2->car, BS_WORD, BO_NATIVE, TRUE, field_info);
	    
	    /* Process case code. */
	    endianness (CDAR (l2), BS_UNKNOWN, BO_NATIVE, FALSE, field_info);
	  }
	break;

      case TOK_FUNC_CALL:
	for (l2 = CDDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    /* Force everything to be native */
	    endianness (l2, BS_UNKNOWN, BO_NATIVE, TRUE, field_info);
	  }
	break;

      case TOK_CAST:
	for (l2 = CDDAR (code); l2 != NULL; l2 = l2->cdr)
	  {
	    /* Just process everything. */
	    endianness (l2, BS_UNKNOWN, BO_NATIVE, TRUE, field_info);
	  }
	break;

      default:
	parse_error (code->car, "Unhandled operator %s in endianness().\n",
		     unparse_token (t, buf));
	break;
      }
    }

  /* If we are backwards and this upsets someone, swap! */
  info = expr_info (code, hint, field_info);
  if (strong_hint && info.order != hint)
    {
      ByteSize s;

      if (desired_size == BS_UNKNOWN)
	s = info.size;
      else if (info.size == BS_UNKNOWN)
	s = desired_size;
      else
	s = MIN (desired_size, info.size);

      swap (code, s, info.sgnd);
    }
}